

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_Show6VarFunc(word F0,word F1)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  if ((F1 & F0) == 0) {
    iVar3 = 5;
    do {
      putchar(0x20);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar1 = (&DAT_006b2d20)[lVar4];
      for (uVar5 = 2; uVar5 != 0xffffffff; uVar5 = uVar5 - 1) {
        printf("%d",(ulong)((uVar1 >> (uVar5 & 0x1f) & 1) != 0));
      }
      putchar(0x20);
    }
    putchar(10);
    iVar3 = 4;
    while( true ) {
      bVar8 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar8) break;
      putchar(0x20);
    }
    putchar(0x2b);
    for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
      iVar6 = 3;
      while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
        putchar(0x2d);
      }
      putchar(0x2b);
    }
    putchar(10);
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      uVar1 = (&DAT_006b2d20)[lVar4];
      for (uVar5 = 2; uVar5 != 0xffffffff; uVar5 = uVar5 - 1) {
        printf("%d",(ulong)((uVar1 >> (uVar5 & 0x1f) & 1) != 0));
      }
      printf(" |");
      for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
        putchar(0x20);
        uVar2 = (ulong)(*(int *)((long)&DAT_006b2d20 + lVar7) + uVar1 * 8);
        iVar3 = 0x20;
        if ((F1 >> (uVar2 & 0x3f) & 1) != 0) {
          iVar3 = 0x31;
        }
        if ((F0 >> (uVar2 & 0x3f) & 1) != 0) {
          iVar3 = 0x30;
        }
        putchar(iVar3);
        printf(" |");
      }
      putchar(10);
      iVar3 = 4;
      while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
        putchar(0x20);
      }
      putchar(0x2b);
      for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
        iVar6 = 3;
        while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
          putchar(0x2d);
        }
        iVar6 = 0x7c;
        if (iVar3 == 7) {
          iVar6 = 0x2b;
        }
        if (lVar4 == 7) {
          iVar6 = 0x2b;
        }
        putchar(iVar6);
      }
      putchar(10);
    }
    return;
  }
  __assert_fail("(F0 & F1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                ,0x700,"void Abc_Show6VarFunc(word, word)");
}

Assistant:

void Abc_Show6VarFunc( word F0, word F1 )
{
    // order of cells in the Karnaugh map
//    int Cells[8] = { 0, 1, 3, 2, 6, 7, 5, 4 };
    int Cells[8] = { 0, 4, 6, 2, 3, 7, 5, 1 };
    // intermediate variables
    int s; // symbol counter
    int h; // horizontal coordinate;
    int v; // vertical coordinate;
    assert( (F0 & F1) == 0 );

    // output minterms above
    for ( s = 0; s < 4; s++ )
        printf( " " );
    printf( " " );
    for ( h = 0; h < 8; h++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "%d",  ((Cells[h] >> (2-s)) & 1) );
        printf( " " );
    }
    printf( "\n" );

    // output horizontal line above
    for ( s = 0; s < 4; s++ )
        printf( " " );
    printf( "+" );
    for ( h = 0; h < 8; h++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "-" );
        printf( "+" );
    }
    printf( "\n" );

    // output lines with function values
    for ( v = 0; v < 8; v++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "%d",  ((Cells[v] >> (2-s)) & 1) );
        printf( " |" );

        for ( h = 0; h < 8; h++ )
        {
            printf( " " );
            if ( ((F0 >> ((Cells[v]*8)+Cells[h])) & 1) )
                printf( "0" );
            else if ( ((F1 >> ((Cells[v]*8)+Cells[h])) & 1) )
                printf( "1" );
            else
                printf( " " );
            printf( " |" );
        }
        printf( "\n" );

        // output horizontal line above
        for ( s = 0; s < 4; s++ )
            printf( " " );
//        printf( "%c", v == 7 ? '+' : '|' );
        printf( "+" );
        for ( h = 0; h < 8; h++ )
        {
            for ( s = 0; s < 3; s++ )
                printf( "-" );
//            printf( "%c", v == 7 ? '+' : '|' );
            printf( "%c", (v == 7 || h == 7) ? '+' : '|' );
        }
        printf( "\n" );
    }
}